

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::InactivityCheck(CConnman *this,CNode *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  time_point tVar6;
  Logger *pLVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  NodeId local_70;
  bool local_62;
  bool local_61;
  NodeId local_60 [5];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tVar6 = NodeClock::now();
  lVar3 = (long)tVar6.__d.__r / 1000000000;
  lVar1 = (node->m_last_send)._M_i.__r;
  lVar2 = (node->m_last_recv)._M_i.__r;
  if (lVar3 <= (this->m_peer_connect_timeout).__r + (node->m_connected).__r) {
LAB_001a4121:
    bVar8 = false;
    goto LAB_001a4123;
  }
  if (lVar1 == 0 || lVar2 == 0) {
    pLVar7 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
    bVar8 = true;
    if (bVar5) {
      local_60[0] = (this->m_peer_connect_timeout).__r;
      local_61 = lVar2 != 0;
      local_62 = lVar1 != 0;
      local_70 = node->id;
      logging_function._M_str = "InactivityCheck";
      logging_function._M_len = 0xf;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<long,bool,bool,long>
                (logging_function,source_file,0x7b2,NET,Debug,(ConstevalFormatString<4U>)0x7d21af,
                 local_60,&local_61,&local_62,&local_70);
    }
    goto LAB_001a4123;
  }
  if (lVar1 + 0x4b0 < lVar3) {
    pLVar7 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
    bVar8 = true;
    if (!bVar5) goto LAB_001a4123;
    local_70 = node->id;
    pcVar10 = "socket sending timeout: %is peer=%d\n";
    iVar9 = 0x7b7;
    lVar2 = lVar1;
LAB_001a4104:
    local_60[0] = lVar3 - lVar2;
    logging_function_00._M_str = "InactivityCheck";
    logging_function_00._M_len = 0xf;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    LogPrintFormatInternal<long,long>
              (logging_function_00,source_file_00,iVar9,NET,Debug,(ConstevalFormatString<2U>)pcVar10
               ,local_60,&local_70);
  }
  else {
    if (lVar2 + 0x4b0 < lVar3) {
      pLVar7 = LogInstance();
      bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
      bVar8 = true;
      if (!bVar5) goto LAB_001a4123;
      local_70 = node->id;
      pcVar10 = "socket receive timeout: %is peer=%d\n";
      iVar9 = 0x7bc;
      goto LAB_001a4104;
    }
    if (((node->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) goto LAB_001a4121;
    (*((node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[2])(local_60);
    cVar4 = (char)local_60[0];
    pLVar7 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar7,NET,Debug);
    if (cVar4 == '\0') {
      bVar8 = true;
      if (!bVar5) goto LAB_001a4123;
      local_60[0] = node->id;
      pcVar10 = "V2 handshake timeout peer=%d\n";
      iVar9 = 0x7c2;
    }
    else {
      bVar8 = true;
      if (!bVar5) goto LAB_001a4123;
      local_60[0] = node->id;
      pcVar10 = "version handshake timeout peer=%d\n";
      iVar9 = 0x7c4;
    }
    logging_function_01._M_str = "InactivityCheck";
    logging_function_01._M_len = 0xf;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_01._M_len = 0x57;
    LogPrintFormatInternal<long>
              (logging_function_01,source_file_01,iVar9,NET,Debug,(ConstevalFormatString<1U>)pcVar10
               ,local_60);
  }
  bVar8 = true;
LAB_001a4123:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::InactivityCheck(const CNode& node) const
{
    // Tests that see disconnects after using mocktime can start nodes with a
    // large timeout. For example, -peertimeout=999999999.
    const auto now{GetTime<std::chrono::seconds>()};
    const auto last_send{node.m_last_send.load()};
    const auto last_recv{node.m_last_recv.load()};

    if (!ShouldRunInactivityChecks(node, now)) return false;

    if (last_recv.count() == 0 || last_send.count() == 0) {
        LogDebug(BCLog::NET, "socket no message in first %i seconds, %d %d peer=%d\n", count_seconds(m_peer_connect_timeout), last_recv.count() != 0, last_send.count() != 0, node.GetId());
        return true;
    }

    if (now > last_send + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket sending timeout: %is peer=%d\n", count_seconds(now - last_send), node.GetId());
        return true;
    }

    if (now > last_recv + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket receive timeout: %is peer=%d\n", count_seconds(now - last_recv), node.GetId());
        return true;
    }

    if (!node.fSuccessfullyConnected) {
        if (node.m_transport->GetInfo().transport_type == TransportProtocolType::DETECTING) {
            LogDebug(BCLog::NET, "V2 handshake timeout peer=%d\n", node.GetId());
        } else {
            LogDebug(BCLog::NET, "version handshake timeout peer=%d\n", node.GetId());
        }
        return true;
    }

    return false;
}